

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O2

int internal_set_status_code_key_name
              (AMQP_MANAGEMENT_HANDLE amqp_management,char *status_code_key_name)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *copied_status_code_key_name;
  
  iVar1 = mallocAndStrcpy_s(&copied_status_code_key_name,status_code_key_name);
  if (iVar1 == 0) {
    free(amqp_management->status_code_key_name);
    amqp_management->status_code_key_name = copied_status_code_key_name;
    iVar1 = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x2c2;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"internal_set_status_code_key_name",0x2c1,1,"Cannot copy status code key name");
    }
  }
  return iVar1;
}

Assistant:

static int internal_set_status_code_key_name(AMQP_MANAGEMENT_HANDLE amqp_management, const char* status_code_key_name)
{
    int result;
    char* copied_status_code_key_name;
    if (mallocAndStrcpy_s(&copied_status_code_key_name, status_code_key_name) != 0)
    {
        LogError("Cannot copy status code key name");
        result = MU_FAILURE;
    }
    else
    {
        if (amqp_management->status_code_key_name != NULL)
        {
            free(amqp_management->status_code_key_name);
        }

        amqp_management->status_code_key_name = copied_status_code_key_name;
        result = 0;
    }

    return result;
}